

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListHeader.cpp
# Opt level: O0

void __thiscall DestListHeader::printDestListHeaderInHexStyle(DestListHeader *this)

{
  ostream *poVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  DestListHeader *local_10;
  DestListHeader *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_____________DestListHeader in HEX style________________");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Version:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,&this->Version);
  Utils::print_vec(&local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_28);
  std::operator<<((ostream *)&std::cout,"TotalNumberOfCurrentEntries:        ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,&this->TotalNumberOfCurrentEntries);
  Utils::print_vec(&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  std::operator<<((ostream *)&std::cout,"TotalNumberOfPinnedEntries:         ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,&this->TotalNumberOfPinnedEntries);
  Utils::print_vec(&local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  std::operator<<((ostream *)&std::cout,"Unknown:                            ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,&this->Unknown);
  Utils::print_vec(&local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
  std::operator<<((ostream *)&std::cout,"LastIssuedEntryId:                  ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_98,&this->LastIssuedEntryId);
  Utils::print_vec(&local_98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
  std::operator<<((ostream *)&std::cout,"NumberOfAddedDeletedReopened:       ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,&this->NumberOfAddedDeletedReopened);
  Utils::print_vec(&local_b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_b0);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DestListHeader::printDestListHeaderInHexStyle() {
    cout << "_____________DestListHeader in HEX style________________" << endl;
    cout << "Version:                            "; Utils::print_vec(Version);
    cout << "TotalNumberOfCurrentEntries:        "; Utils::print_vec(TotalNumberOfCurrentEntries);
    cout << "TotalNumberOfPinnedEntries:         "; Utils::print_vec(TotalNumberOfPinnedEntries);
    cout << "Unknown:                            "; Utils::print_vec(Unknown);
    cout << "LastIssuedEntryId:                  "; Utils::print_vec(LastIssuedEntryId);
    cout << "NumberOfAddedDeletedReopened:       "; Utils::print_vec(NumberOfAddedDeletedReopened);
    cout << "_________________________________________________________" << endl;
}